

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::maxdirfiltered<ConvexDecomposition::float3>
              (float3 *p,int count,float3 *dir,Array<int> *allow)

{
  undefined1 auVar1 [16];
  int *piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  undefined1 extraout_var [12];
  float local_34;
  
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x894,
                  "int ConvexDecomposition::maxdirfiltered(const T *, int, const T &, Array<int> &) [T = ConvexDecomposition::float3]"
                 );
  }
  local_34 = dot(p,dir);
  uVar4 = 0xffffffffffffffff;
  for (uVar5 = 0; iVar3 = (int)uVar4, (uint)(~(count >> 0x1f) & count) != uVar5; uVar5 = uVar5 + 1)
  {
    piVar2 = Array<int>::operator[](allow,(int)uVar5);
    if (*piVar2 != 0) {
      if (iVar3 == -1) {
        uVar4 = uVar5 & 0xffffffff;
      }
      else {
        fVar6 = dot(p,dir);
        auVar1._4_12_ = extraout_var;
        auVar1._0_4_ = fVar6;
        auVar1 = vmaxss_avx(auVar1,ZEXT416((uint)local_34));
        if (local_34 < fVar6) {
          uVar4 = uVar5;
        }
        uVar4 = uVar4 & 0xffffffff;
        local_34 = auVar1._0_4_;
      }
    }
    p = p + 1;
  }
  if (iVar3 != -1) {
    return iVar3;
  }
  __assert_fail("m!=-1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x8aa,
                "int ConvexDecomposition::maxdirfiltered(const T *, int, const T &, Array<int> &) [T = ConvexDecomposition::float3]"
               );
}

Assistant:

int maxdirfiltered(const T *p,int count,const T &dir,Array<int> &allow)
{
	assert(count);
	int m=-1;
	float currDotm = dot(p[0], dir);
	for(int i=0;i<count;i++) 
	{
		if(allow[i])
		{
			if(m==-1 )
			{
				m=i;
			}
			else 
			{
				const float currDoti = dot(p[i], dir);
				if (currDoti>currDotm)
				{
					currDotm = currDoti;
					m=i;
				}
			}
		}
	}
	assert(m!=-1);
	return m;
}